

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_strings.c
# Opt level: O0

char * cubeb_strings_lookup(cubeb_strings *strings,char *s)

{
  int iVar1;
  long *plVar2;
  char *in_RSI;
  long in_RDI;
  char **se;
  char **sp;
  long *local_20;
  
  if ((in_RDI != 0) && (in_RSI != (char *)0x0)) {
    local_20 = *(long **)(in_RDI + 8);
    plVar2 = local_20 + *(uint *)(in_RDI + 4);
    for (; local_20 != plVar2; local_20 = local_20 + 1) {
      if ((*local_20 != 0) && (iVar1 = strcmp((char *)*local_20,in_RSI), iVar1 == 0)) {
        return (char *)*local_20;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char const *
cubeb_strings_lookup(cubeb_strings * strings, char const * s)
{
  char ** sp = NULL;
  char ** se = NULL;

  if (!strings || !s) {
    return NULL;
  }

  sp = strings->data;
  se = sp + strings->count;

  for (; sp != se; sp++) {
    if (*sp && strcmp(*sp, s) == 0) {
      return *sp;
    }
  }

  return NULL;
}